

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O3

IoctlResponse * __thiscall
Future<IoctlResponse>::get(IoctlResponse *__return_storage_ptr__,Future<IoctlResponse> *this)

{
  element_type *peVar1;
  short sVar2;
  IoctlResponse local_30;
  
  if ((this->is_done_ == false) &&
     (peVar1 = (this->task_).
               super___shared_ptr<AsyncTask<IoctlResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (**peVar1->_vptr_AsyncTask)(&local_30);
    (this->result_).super_NamenodeResponse.type_ = local_30.super_NamenodeResponse.type_;
    (this->result_).super_NamenodeResponse.error_ = local_30.super_NamenodeResponse.error_;
    *(undefined8 *)&(this->result_).super_NamenodeResponse.field_0xc = local_30._12_8_;
    *(undefined4 *)((long)&(this->result_).count_ + 4) = local_30.count_._4_4_;
    IoctlResponse::~IoctlResponse(&local_30);
    this->is_done_ = true;
  }
  sVar2 = (this->result_).super_NamenodeResponse.error_;
  (__return_storage_ptr__->super_NamenodeResponse).type_ =
       (this->result_).super_NamenodeResponse.type_;
  (__return_storage_ptr__->super_NamenodeResponse).error_ = sVar2;
  (__return_storage_ptr__->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_00130ba0;
  *(undefined8 *)&(__return_storage_ptr__->super_NamenodeResponse).field_0xc =
       *(undefined8 *)&(this->result_).super_NamenodeResponse.field_0xc;
  *(undefined4 *)((long)&__return_storage_ptr__->count_ + 4) =
       *(undefined4 *)((long)&(this->result_).count_ + 4);
  return __return_storage_ptr__;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }